

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_0::AsyncStreamFd::write(AsyncStreamFd *this,int __fd,void *__buf,size_t __n)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  size_t sVar2;
  undefined4 in_register_00000034;
  size_t sVar3;
  ArrayPtr<const_unsigned_char> firstPiece;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces;
  
  firstPiece.ptr._4_4_ = in_register_00000034;
  firstPiece.ptr._0_4_ = __fd;
  if (__n == 0) {
    sVar2 = 0;
    pAVar1 = (ArrayPtr<const_unsigned_char> *)0x0;
    sVar3 = 0;
  }
  else {
    sVar2 = *__buf;
    pAVar1 = *(ArrayPtr<const_unsigned_char> **)((long)__buf + 8);
    sVar3 = (long)__buf + 0x10;
  }
  firstPiece.size_ = sVar2;
  morePieces.size_ = sVar3;
  morePieces.ptr = pAVar1;
  writeInternal(this,firstPiece,morePieces,(ArrayPtr<const_int>)ZEXT816(0));
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    if (pieces.size() == 0) {
      return writeInternal(nullptr, nullptr, nullptr);
    } else {
      return writeInternal(pieces[0], pieces.slice(1, pieces.size()), nullptr);
    }
  }